

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O3

void __thiscall
cppcms::impl::cgi::
socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
::on_accept(socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
            *this,error_code *e)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  context *this_01;
  shared_ptr<cppcms::http::context> cnt;
  shared_ptr<cppcms::impl::cgi::connection> local_38;
  context *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  if (e->_M_value == 0) {
    if (this->tcp_ == true) {
      booster::aio::basic_socket::set_option(this->asio_socket_,0,1);
    }
    if (this->sndbuf_ != -1) {
      booster::aio::basic_socket::set_option(this->asio_socket_,1);
    }
    if (this->rcvbuf_ != -1) {
      booster::aio::basic_socket::set_option(this->asio_socket_,0);
    }
    this_01 = (context *)operator_new(0x28);
    local_38.super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->api_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_38.super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->api_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_38.super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_38.super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38.super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_38.super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    cppcms::http::context::context(this_01,&local_38);
    std::__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppcms::http::context,void>
              ((__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2> *)&local_28,this_01);
    if (local_38.super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.
                 super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    this_00 = (this->api_).
              super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->api_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (this->api_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    cppcms::http::context::run(local_28);
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
  }
  (**(this->super_acceptor)._vptr_acceptor)(this);
  return;
}

Assistant:

void on_accept(booster::system::error_code const &e)
			{
				if(!e) {
					
					if(tcp_)
						asio_socket_->set_option(io::basic_socket::tcp_no_delay,true);
					if(sndbuf_!=-1)
						asio_socket_->set_option(io::basic_socket::send_buffer_size,sndbuf_);
					if(rcvbuf_!=-1)
						asio_socket_->set_option(io::basic_socket::receive_buffer_size,rcvbuf_);
					booster::shared_ptr< ::cppcms::http::context> cnt(new ::cppcms::http::context(api_));
					api_.reset();
					cnt->run();	
				}
				async_accept();
			}